

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_template_generator.c
# Opt level: O0

_Bool pi_template_resolve_symbol
                (pi_template_generator_t *ptg_context,dino_string_ptr symbol_buffer,
                dino_string_ptr result_buffer)

{
  dino_intmap_t *pdVar1;
  code *pcVar2;
  byte bVar3;
  char *pcVar4;
  char *pcVar5;
  char *local_30;
  char *result_ptr;
  _Bool valid;
  dino_string_ptr pdStack_20;
  operator_type_t operator_type;
  dino_string_ptr result_buffer_local;
  dino_string_ptr symbol_buffer_local;
  pi_template_generator_t *ptg_context_local;
  
  pdVar1 = ptg_context->symbol_map;
  pdStack_20 = result_buffer;
  result_buffer_local = symbol_buffer;
  symbol_buffer_local = (dino_string_ptr)ptg_context;
  pcVar4 = dino_string_c_ptr(symbol_buffer);
  result_ptr._4_4_ = intmap_get_value(pdVar1,pcVar4);
  result_ptr._3_1_ = 0;
  if ((result_ptr._4_4_ == 0) || (result_ptr._4_4_ == 1)) {
    if (pdStack_20 != (dino_string_ptr)0x0) {
      dino_string_reset(pdStack_20);
    }
    local_30 = (char *)0x0;
    pcVar2 = (code *)symbol_buffer_local->position;
    pcVar4 = symbol_buffer_local->c_string;
    pcVar5 = dino_string_c_ptr(result_buffer_local);
    bVar3 = (*pcVar2)(pcVar4,pcVar5,&local_30);
    result_ptr._3_1_ = bVar3 & 1;
    if (local_30 != (char *)0x0) {
      dino_string_append_str(pdStack_20,local_30);
      free(local_30);
    }
    if (((result_ptr._3_1_ & 1) != 0) && (result_ptr._4_4_ == 0)) {
      pdVar1 = (dino_intmap_t *)symbol_buffer_local[1].c_string;
      pcVar4 = dino_string_c_ptr(result_buffer_local);
      intmap_put(pdVar1,pcVar4,1);
    }
  }
  return (_Bool)(result_ptr._3_1_ & 1);
}

Assistant:

bool pi_template_resolve_symbol(pi_template_generator_t *ptg_context,
                                dino_string_ptr symbol_buffer,
                                dino_string_ptr result_buffer) {

    operator_type_t operator_type = (operator_type_t) intmap_get_value(ptg_context->symbol_map,
                                                                       dino_string_c_ptr(symbol_buffer));

    bool valid = false;

    if (operator_type == operator_type_invalid || operator_type == operator_type_variable) {

        if (result_buffer) {
            dino_string_reset(result_buffer);
        }

        char *result_ptr = NULL;
        valid = (*ptg_context->function_string_ptr)(ptg_context->context_ptr,
                                                    dino_string_c_ptr(symbol_buffer),
                                                    &result_ptr);

        if (result_ptr != NULL) {
            dino_string_append_str(result_buffer, result_ptr);
            free(result_ptr);
        }

        if (valid && operator_type == operator_type_invalid) {
            intmap_put(ptg_context->symbol_map, dino_string_c_ptr(symbol_buffer), operator_type_variable);
        }

    }

    return valid;
}